

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGGradientElement::collectGradientAttributes
          (SVGGradientElement *this,SVGGradientAttributes *attributes)

{
  bool bVar1;
  ElementID EVar2;
  SVGNodeList *this_00;
  reference node;
  SVGElement *this_01;
  SVGElement *element;
  unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *child;
  const_iterator __end2;
  const_iterator __begin2;
  SVGNodeList *__range2;
  SVGGradientAttributes *attributes_local;
  SVGGradientElement *this_local;
  
  bVar1 = SVGGradientAttributes::hasGradientTransform(attributes);
  if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)this,GradientTransform), bVar1)) {
    SVGGradientAttributes::setGradientTransform(attributes,this);
  }
  bVar1 = SVGGradientAttributes::hasSpreadMethod(attributes);
  if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)this,SpreadMethod), bVar1)) {
    SVGGradientAttributes::setSpreadMethod(attributes,this);
  }
  bVar1 = SVGGradientAttributes::hasGradientUnits(attributes);
  if ((!bVar1) && (bVar1 = SVGElement::hasAttribute((SVGElement *)this,GradientUnits), bVar1)) {
    SVGGradientAttributes::setGradientUnits(attributes,this);
  }
  bVar1 = SVGGradientAttributes::hasGradientContentElement(attributes);
  if (!bVar1) {
    this_00 = SVGElement::children_abi_cxx11_((SVGElement *)this);
    __end2 = std::__cxx11::
             list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
             ::begin(this_00);
    child = (unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
            std::__cxx11::
            list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
            ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&child), bVar1) {
      node = std::
             _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
             ::operator*(&__end2);
      this_01 = toSVGElement(node);
      if ((this_01 != (SVGElement *)0x0) && (EVar2 = SVGElement::id(this_01), EVar2 == Stop)) {
        SVGGradientAttributes::setGradientContentElement(attributes,this);
        return;
      }
      std::
      _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void SVGGradientElement::collectGradientAttributes(SVGGradientAttributes& attributes) const
{
    if(!attributes.hasGradientTransform() && hasAttribute(PropertyID::GradientTransform))
        attributes.setGradientTransform(this);
    if(!attributes.hasSpreadMethod() && hasAttribute(PropertyID::SpreadMethod))
        attributes.setSpreadMethod(this);
    if(!attributes.hasGradientUnits() && hasAttribute(PropertyID::GradientUnits))
        attributes.setGradientUnits(this);
    if(!attributes.hasGradientContentElement()) {
        for(const auto& child : children()) {
            if(auto element = toSVGElement(child); element && element->id() == ElementID::Stop) {
                attributes.setGradientContentElement(this);
                break;
            }
        }
    }
}